

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vnode.c
# Opt level: O1

int evfilt_vnode_copyout(kevent *dst,int nevents,filter *filt,knote *src,void *ptr)

{
  unsigned_short *puVar1;
  uintptr_t uVar2;
  void *pvVar3;
  short sVar4;
  unsigned_short uVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  stat_conflict sb;
  uint8_t buf [272];
  stat local_1c0;
  inotify_event local_130 [17];
  
  iVar7 = get_one_event(local_130,0x110,(src->field_10).kn_vnode.inotifyfd);
  if (iVar7 < 0) {
    return -1;
  }
  if (-1 < (short)local_130[0].mask) {
    if ((local_130[0].mask & 0x18) == 0) {
      uVar2 = (src->kev).ident;
      sVar4 = (src->kev).filter;
      uVar5 = (src->kev).flags;
      uVar6 = (src->kev).fflags;
      pvVar3 = (src->kev).udata;
      dst->data = (src->kev).data;
      dst->udata = pvVar3;
      dst->ident = uVar2;
      dst->filter = sVar4;
      dst->flags = uVar5;
      dst->fflags = uVar6;
      dst->data = 0;
      dst->fflags = 0;
      iVar7 = fstat((int)(src->kev).ident,&local_1c0);
      if ((iVar7 < 0) && (piVar8 = __errno_location(), *piVar8 == 2)) {
        if (((src->kev).fflags & 1) != 0) {
          *(byte *)&dst->fflags = (byte)dst->fflags | 1;
        }
      }
      else if ((local_130[0].mask & 6) != 0) {
        if ((local_1c0.st_nlink == 0) && (((src->kev).fflags & 1) != 0)) {
          *(byte *)&dst->fflags = (byte)dst->fflags | 1;
        }
        if ((local_1c0.st_nlink != (src->field_10).kn_vnode.nlink) &&
           (((src->kev).fflags & 0x10) != 0)) {
          *(byte *)&dst->fflags = (byte)dst->fflags | 0x10;
        }
        if (((src->field_10).kn_vnode.size < local_1c0.st_size) && (((src->kev).fflags & 2) != 0)) {
          *(byte *)&dst->fflags = (byte)dst->fflags | 4;
        }
        (src->field_10).kn_vnode.nlink = local_1c0.st_nlink;
        (src->field_10).kn_vnode.size = local_1c0.st_size;
      }
      if (((local_130[0].mask & 2) != 0) && (((src->kev).fflags & 2) != 0)) {
        *(byte *)&dst->fflags = (byte)dst->fflags | 2;
      }
      if (((local_130[0].mask & 4) != 0) && (((src->kev).fflags & 8) != 0)) {
        *(byte *)&dst->fflags = (byte)dst->fflags | 8;
      }
      if (((local_130[0].mask >> 0xb & 1) != 0) && (((src->kev).fflags & 0x20) != 0)) {
        *(byte *)&dst->fflags = (byte)dst->fflags | 0x20;
      }
      if (((local_130[0].mask >> 10 & 1) != 0) && (((src->kev).fflags & 1) != 0)) {
        *(byte *)&dst->fflags = (byte)dst->fflags | 1;
      }
      iVar7 = 0;
      if (((src->kev).flags & 0x80) != 0) {
        iVar7 = knote_disable(filt,src);
      }
      if (((src->kev).flags & 0x10) != 0) {
        iVar7 = knote_delete(filt,src);
      }
      return iVar7 >> 0x1f | 1;
    }
    puVar1 = &(src->kev).flags;
    *(byte *)puVar1 = (byte)*puVar1 | 0x10;
  }
  dst->filter = 0;
  return 0;
}

Assistant:

int
evfilt_vnode_copyout(struct kevent *dst, UNUSED int nevents, struct filter *filt,
    struct knote *src, void *ptr UNUSED)
{
    uint8_t buf[sizeof(struct inotify_event) + NAME_MAX + 1] __attribute__ ((aligned(__alignof__(struct inotify_event))));
    struct inotify_event *evt;
    struct stat sb;

    evt = (struct inotify_event *)buf;
    if (get_one_event(evt, sizeof(buf), src->kn_vnode.inotifyfd) < 0)
        return (-1);

    dbg_printf("inotify event: %s", inotify_event_dump(evt));
    if (evt->mask & IN_IGNORED) {
        /* TODO: possibly return error when fs is unmounted */
        dst->filter = 0;
        return (0);
    }

    /* Check if the watched file has been closed, and
       XXX-this may not exactly match the kevent() behavior if multiple file de
scriptors reference the same file.
    */
    if (evt->mask & IN_CLOSE_WRITE || evt->mask & IN_CLOSE_NOWRITE) {
        src->kev.flags |= EV_ONESHOT; /* KLUDGE: causes the knote to be deleted */
        dst->filter = 0; /* KLUDGE: causes the event to be discarded */
        return (0);
    }

    memcpy(dst, &src->kev, sizeof(*dst));
    dst->data = 0;
    dst->fflags = 0;

    /* No error checking because fstat(2) should rarely fail */
    //FIXME: EINTR
    if (fstat(src->kev.ident, &sb) < 0 && errno == ENOENT) {
        if (src->kev.fflags & NOTE_DELETE)
            dst->fflags |= NOTE_DELETE;
    } else {
        if ((evt->mask & IN_ATTRIB || evt->mask & IN_MODIFY)) {
            if (sb.st_nlink == 0 && src->kev.fflags & NOTE_DELETE)
                dst->fflags |= NOTE_DELETE;
            if (sb.st_nlink != src->kn_vnode.nlink &&
                src->kev.fflags & NOTE_LINK)
                dst->fflags |= NOTE_LINK;
#if HAVE_NOTE_TRUNCATE
            if (sb.st_nsize == 0 && src->kev.fflags & NOTE_TRUNCATE)
                dst->fflags |= NOTE_TRUNCATE;
#endif
            if (sb.st_size > src->kn_vnode.size &&
                src->kev.fflags & NOTE_WRITE)
                dst->fflags |= NOTE_EXTEND;
            src->kn_vnode.nlink = sb.st_nlink;
            src->kn_vnode.size = sb.st_size;
        }
    }

    if (evt->mask & IN_MODIFY && src->kev.fflags & NOTE_WRITE)
        dst->fflags |= NOTE_WRITE;
    if (evt->mask & IN_ATTRIB && src->kev.fflags & NOTE_ATTRIB)
        dst->fflags |= NOTE_ATTRIB;
    if (evt->mask & IN_MOVE_SELF && src->kev.fflags & NOTE_RENAME)
        dst->fflags |= NOTE_RENAME;
    if (evt->mask & IN_DELETE_SELF && src->kev.fflags & NOTE_DELETE)
        dst->fflags |= NOTE_DELETE;

    if (knote_copyout_flag_actions(filt, src) < 0) return -1;

    return (1);
}